

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void h2v2_merged_upsample_565D
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  jpeg_upsampler *pjVar6;
  JSAMPLE *pJVar7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var8;
  long lVar9;
  _func_void_j_decompress_ptr *p_Var10;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr01;
  JSAMPROW inptr00;
  JSAMPROW outptr1;
  JSAMPROW outptr0;
  int cr;
  int cb;
  int cblue;
  int cgreen;
  int cred;
  int y;
  my_merged_upsample_ptr upsample;
  JLONG rgb_1;
  uint b_1;
  uint g_1;
  uint r_1;
  JLONG d1_1;
  JLONG d0_1;
  JLONG *Cbgtab_1;
  JLONG *Crgtab_1;
  int *Cbbtab_1;
  int *Crrtab_1;
  JSAMPLE *range_limit_1;
  JDIMENSION col_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr01_1;
  JSAMPROW inptr00_1;
  JSAMPROW outptr1_1;
  JSAMPROW outptr0_1;
  int cr_1;
  int cb_1;
  int cblue_1;
  int cgreen_1;
  int cred_1;
  int y_1;
  my_merged_upsample_ptr upsample_1;
  ulong local_b0;
  ulong local_a8;
  JSAMPARRAY output_buf_local;
  JDIMENSION in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  int test_value;
  JLONG rgb;
  ushort *puStack_50;
  uint b;
  uint g;
  uint r;
  JLONG d1;
  JLONG d0;
  JLONG *Cbgtab;
  JLONG *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  JDIMENSION col;
  
  pjVar6 = cinfo->upsample;
  pJVar7 = cinfo->sample_range_limit;
  p_Var8 = pjVar6[1].upsample;
  lVar9 = *(long *)&pjVar6[1].need_context_rows;
  p_Var10 = pjVar6[2].start_pass;
  p_Var11 = pjVar6[2].upsample;
  local_a8 = dither_matrix[cinfo->output_scanline & 3];
  local_b0 = dither_matrix[cinfo->output_scanline + 1 & 3];
  rgb = (JLONG)(*input_buf)[in_row_group_ctr << 1];
  _test_value = (*input_buf)[in_row_group_ctr * 2 + 1];
  _g = (ushort *)*output_buf;
  puStack_50 = (ushort *)output_buf[1];
  input_buf_local = (JSAMPIMAGE)input_buf[2][in_row_group_ctr];
  cinfo_local = (j_decompress_ptr)input_buf[1][in_row_group_ctr];
  for (in_row_group_ctr_local = cinfo->output_width >> 1; in_row_group_ctr_local != 0;
      in_row_group_ctr_local = in_row_group_ctr_local - 1) {
    iVar4 = *(int *)(p_Var8 + (long)(int)(uint)*(byte *)input_buf_local * 4);
    iVar12 = (int)((ulong)(*(long *)(p_Var11 + (long)(int)(uint)*(byte *)&cinfo_local->err * 8) +
                          *(long *)(p_Var10 + (long)(int)(uint)*(byte *)input_buf_local * 8)) >>
                  0x10);
    iVar5 = *(int *)(lVar9 + (long)(int)(uint)*(byte *)&cinfo_local->err * 4);
    pbVar15 = (byte *)(rgb + 1);
    uVar13 = (uint)*(byte *)rgb;
    uVar17 = local_a8 & 0xff;
    uVar18 = local_a8 & 0xff;
    uVar19 = local_a8 & 0xff;
    uVar16 = (long)local_a8 >> 8;
    rgb = rgb + 2;
    uVar14 = (uint)*pbVar15;
    bVar1 = pJVar7[(long)(int)(uVar14 + iVar4) + (uVar16 & 0xff)];
    bVar2 = pJVar7[(long)(int)(uVar14 + iVar12) + ((long)(uVar16 & 0xff) >> 1)];
    bVar3 = pJVar7[(long)(int)(uVar14 + iVar5) + (uVar16 & 0xff)];
    local_a8 = (uVar16 & 0xff) << 0x18 | (long)((local_a8 & 0xff) << 0x18 | uVar16 & 0xffffff) >> 8;
    *_g = (pJVar7[(long)(int)(uVar13 + iVar4) + uVar17] & 0xf8) << 8 |
          (pJVar7[(long)(int)(uVar13 + iVar12) + ((long)uVar18 >> 1)] & 0xfc) << 3 |
          (ushort)(pJVar7[(long)(int)(uVar13 + iVar5) + uVar19] >> 3);
    _g[1] = (bVar1 & 0xf8) << 8 | (bVar2 & 0xfc) << 3 | (ushort)(bVar3 >> 3);
    _g = _g + 2;
    pbVar15 = _test_value + 1;
    uVar13 = (uint)*_test_value;
    uVar17 = local_b0 & 0xff;
    uVar18 = local_b0 & 0xff;
    uVar19 = local_b0 & 0xff;
    uVar16 = (long)local_b0 >> 8;
    _test_value = _test_value + 2;
    uVar14 = (uint)*pbVar15;
    bVar1 = pJVar7[(long)(int)(uVar14 + iVar4) + (uVar16 & 0xff)];
    bVar2 = pJVar7[(long)(int)(uVar14 + iVar12) + ((long)(uVar16 & 0xff) >> 1)];
    bVar3 = pJVar7[(long)(int)(uVar14 + iVar5) + (uVar16 & 0xff)];
    local_b0 = (uVar16 & 0xff) << 0x18 | (long)((local_b0 & 0xff) << 0x18 | uVar16 & 0xffffff) >> 8;
    *puStack_50 = (pJVar7[(long)(int)(uVar13 + iVar4) + uVar17] & 0xf8) << 8 |
                  (pJVar7[(long)(int)(uVar13 + iVar12) + ((long)uVar18 >> 1)] & 0xfc) << 3 |
                  (ushort)(pJVar7[(long)(int)(uVar13 + iVar5) + uVar19] >> 3);
    puStack_50[1] = (bVar1 & 0xf8) << 8 | (bVar2 & 0xfc) << 3 | (ushort)(bVar3 >> 3);
    puStack_50 = puStack_50 + 2;
    input_buf_local = (JSAMPIMAGE)((long)input_buf_local + 1);
    cinfo_local = (j_decompress_ptr)((long)&cinfo_local->err + 1);
  }
  if ((cinfo->output_width & 1) != 0) {
    iVar4 = *(int *)(p_Var8 + (long)(int)(uint)*(byte *)input_buf_local * 4);
    iVar12 = (int)((ulong)(*(long *)(p_Var11 + (long)(int)(uint)*(byte *)&cinfo_local->err * 8) +
                          *(long *)(p_Var10 + (long)(int)(uint)*(byte *)input_buf_local * 8)) >>
                  0x10);
    iVar5 = *(int *)(lVar9 + (long)(int)(uint)*(byte *)&cinfo_local->err * 4);
    uVar13 = (uint)*(byte *)rgb;
    *_g = (pJVar7[(long)(int)(uVar13 + iVar4) + (local_a8 & 0xff)] & 0xf8) << 8 |
          (pJVar7[(long)(int)(uVar13 + iVar12) + ((long)(local_a8 & 0xff) >> 1)] & 0xfc) << 3 |
          (ushort)(pJVar7[(long)(int)(uVar13 + iVar5) + (local_a8 & 0xff)] >> 3);
    uVar13 = (uint)*_test_value;
    *puStack_50 = (pJVar7[(long)(int)(uVar13 + iVar4) + (local_b0 & 0xff)] & 0xf8) << 8 |
                  (pJVar7[(long)(int)(uVar13 + iVar12) + ((long)(local_b0 & 0xff) >> 1)] & 0xfc) <<
                  3 | (ushort)(pJVar7[(long)(int)(uVar13 + iVar5) + (local_b0 & 0xff)] >> 3);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample_565D(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                          JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v2_merged_upsample_565D_be(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
  else
    h2v2_merged_upsample_565D_le(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
}